

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderRenderCase::computeFragmentReference
          (ShaderRenderCase *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  PixelFormat *pPVar4;
  float *pfVar5;
  Vec4 *local_280;
  RGBA local_270;
  undefined1 local_26c [8];
  Vec4 color;
  float sy;
  float sx;
  int x;
  int y;
  ShaderEvalContext evalCtx;
  bool hasAlpha;
  int height;
  int width;
  QuadGrid *quadGrid_local;
  Surface *result_local;
  ShaderRenderCase *this_local;
  
  iVar1 = tcu::Surface::getWidth(result);
  iVar2 = tcu::Surface::getHeight(result);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar4 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar3));
  evalCtx.quadGrid._7_1_ = 0 < pPVar4->alphaBits;
  ShaderEvalContext::ShaderEvalContext((ShaderEvalContext *)&x,quadGrid);
  for (sx = 0.0; (int)sx < iVar2; sx = (float)((int)sx + 1)) {
    for (sy = 0.0; (int)sy < iVar1; sy = (float)((int)sy + 1)) {
      ShaderEvalContext::reset
                ((ShaderEvalContext *)&x,((float)(int)sy + 0.5) / (float)iVar1,
                 ((float)(int)sx + 0.5) / (float)iVar2);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&x);
      if ((evalCtx.color.m_data[2]._0_1_ & 1) == 0) {
        local_280 = (Vec4 *)&evalCtx.textures[3].tex3D;
      }
      else {
        local_280 = &this->m_clearColor;
      }
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_26c,local_280);
      if ((evalCtx.quadGrid._7_1_ & 1) == 0) {
        pfVar5 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_26c);
        *pfVar5 = 1.0;
      }
      tcu::RGBA::RGBA(&local_270,(Vec4 *)local_26c);
      tcu::Surface::setPixel(result,(int)sy,(int)sx,local_270);
    }
  }
  ShaderEvalContext::~ShaderEvalContext((ShaderEvalContext *)&x);
  return;
}

Assistant:

void ShaderRenderCase::computeFragmentReference (Surface& result, const QuadGrid& quadGrid)
{
	// Buffer info.
	int					width		= result.getWidth();
	int					height		= result.getHeight();
	bool				hasAlpha	= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	ShaderEvalContext	evalCtx		(quadGrid);

	// Render.
	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		float sx = ((float)x + 0.5f) / (float)width;
		float sy = ((float)y + 0.5f) / (float)height;

		evalCtx.reset(sx, sy);
		m_evaluator.evaluate(evalCtx);
		// Select either clear color or computed color based on discarded bit.
		Vec4 color = evalCtx.isDiscarded ? m_clearColor : evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		result.setPixel(x, y, tcu::RGBA(color));
	}
}